

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O2

void d(longlong g,int *y,int *mm,int *dd)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar2 = (g * 10000 + 0x39bc) / 0x37bb49;
  iVar5 = (int)uVar2;
  *y = iVar5;
  uVar3 = iVar5 >> 0x1f;
  iVar4 = iVar5 * -0x16d + (int)g + (int)((long)((ulong)uVar3 << 0x20 | uVar2 & 0xffffffff) / -4) +
          (int)((long)((ulong)uVar3 << 0x20 | uVar2 & 0xffffffff) / 100) +
          (int)((long)((ulong)uVar3 << 0x20 | uVar2 & 0xffffffff) / -400);
  if (iVar4 < 0) {
    iVar5 = iVar5 + -1;
    *y = iVar5;
    iVar4 = iVar5 / -400 + iVar5 / 100 + (int)g + iVar5 * -0x16d + iVar5 / -4;
  }
  iVar5 = (iVar4 * 100 + 0x34) / 0xbf4;
  iVar1 = iVar5 + 2;
  *mm = iVar1 % 0xc + 1;
  *y = *y + iVar1 / 0xc;
  *dd = (iVar5 * 0x132 + 5) / -10 + iVar4 + 1;
  return;
}

Assistant:

void d(long long g, int &y, int &mm, int &dd)
{
	y = (10000 * g + 14780) / 3652425;
	int ddd = g - (365 * y + y / 4 - y / 100 + y / 400);
	if (ddd < 0) {
		y = y - 1;
		ddd = g - (365 * y + y / 4 - y / 100 + y / 400);
	}
	int mi = (100 * ddd + 52) / 3060;
	mm = (mi + 2) % 12 + 1;
	y = y + (mi + 2) / 12;
	dd = ddd - (mi * 306 + 5) / 10 + 1;
	return;
}